

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffcmph(fitsfile *fptr,int *status)

{
  size_t sVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  ulong uVar5;
  FITSfile *pFVar6;
  size_t sVar7;
  void *__ptr;
  size_t __size;
  long lVar8;
  fitsfile *tptr;
  void *local_158;
  int typecode;
  long local_148;
  size_t local_140;
  int local_134;
  LONGLONG repeat;
  LONGLONG local_128;
  ulong local_120;
  long local_118;
  LONGLONG offset;
  LONGLONG overlap;
  LONGLONG unused;
  int valid;
  LONGLONG pcount;
  char message [81];
  char comm [73];
  
  if (0 < *status) {
    return *status;
  }
  fftheap(fptr,(LONGLONG *)0x0,&unused,&overlap,&valid,status);
  if (valid == 0) {
    *status = 0x108;
    iVar2 = 0x108;
  }
  else {
    if ((((fptr->Fptr->hdutype == 2) && (fptr->Fptr->heapsize != 0)) &&
        (overlap != 0 || unused != 0)) && (*status < 1)) {
      iVar2 = ffinit(&tptr,"mem://tempheapfile",status);
      if (iVar2 == 0) {
        iVar2 = ffcopy(fptr,tptr,0,status);
        if (iVar2 == 0) {
          local_140 = 10000;
          local_158 = malloc(10000);
          if (local_158 == (void *)0x0) {
            builtin_strncpy(message + 0x20,"y the heap",0xb);
            builtin_strncpy(message + 0x10,"te buffer to cop",0x10);
            builtin_strncpy(message,"Failed to alloca",0x10);
            ffpmsg(message);
            ffclos(tptr,status);
            *status = 0x71;
            return 0x71;
          }
          local_118 = tptr->Fptr->heapstart + tptr->Fptr->datastart;
          pFVar6 = fptr->Fptr;
          local_148 = pFVar6->heapstart + pFVar6->datastart;
          local_128 = pFVar6->heapsize;
          pFVar6->heapsize = 0;
          iVar2 = 1;
          while( true ) {
            lVar8 = 1;
            if ((pFVar6->tfield < iVar2) || (0 < *status)) break;
            ffgtcl(tptr,iVar2,&typecode,(long *)0x0,(long *)0x0,status);
            pFVar6 = fptr->Fptr;
            __ptr = local_158;
            if (typecode < 1) {
              local_120 = (ulong)(uint)-typecode / 10;
              local_134 = iVar2;
              while (sVar1 = local_140, lVar8 <= pFVar6->numrows) {
                ffgdesll(tptr,iVar2,lVar8,&repeat,&offset,status);
                if (typecode == -1) {
                  __size = (repeat + 7) / 8;
                }
                else {
                  __size = repeat * local_120;
                }
                sVar7 = sVar1;
                pvVar3 = __ptr;
                if (((long)sVar1 < (long)__size) &&
                   (pvVar3 = realloc(__ptr,__size), sVar7 = __size, pvVar3 == (void *)0x0)) {
                  *status = 0x71;
                  sVar7 = sVar1;
                  pvVar3 = __ptr;
                }
                local_158 = pvVar3;
                pFVar6 = fptr->Fptr;
                local_140 = sVar7;
                if (pFVar6->lasthdu == 0) {
                  lVar4 = local_148 + __size + pFVar6->heapsize;
                  if (pFVar6->headstart[(long)pFVar6->curhdu + 1] < lVar4) {
                    lVar4 = (lVar4 + ~pFVar6->headstart[(long)pFVar6->curhdu + 1]) / 0xb40 + 1;
                    iVar2 = ffiblk(fptr,lVar4,1,status);
                    if (0 < iVar2) {
                      snprintf(message,0x51,
                               "Failed to extend the size of the variable length heap by %ld blocks."
                               ,lVar4);
                      ffpmsg(message);
                    }
                  }
                }
                ffmbyt(tptr,offset + local_118,0,status);
                __ptr = local_158;
                ffgbyt(tptr,__size,local_158,status);
                ffmbyt(fptr,fptr->Fptr->heapsize + local_148,1,status);
                ffpbyt(fptr,__size,__ptr,status);
                iVar2 = local_134;
                ffpdes(fptr,local_134,lVar8,repeat,fptr->Fptr->heapsize,status);
                pFVar6 = fptr->Fptr;
                pFVar6->heapsize = pFVar6->heapsize + __size;
                lVar8 = lVar8 + 1;
                if (0 < *status) {
                  free(__ptr);
                  goto LAB_00140974;
                }
              }
            }
            local_158 = __ptr;
            iVar2 = iVar2 + 1;
          }
          free(local_158);
          ffclos(tptr,status);
          pFVar6 = fptr->Fptr;
          lVar8 = pFVar6->heapsize;
          uVar5 = pFVar6->headstart[(long)pFVar6->curhdu + 1] - (local_148 + lVar8);
          if (0xb3f < (long)uVar5) {
            pFVar6->heapsize = local_128;
            ffdblk(fptr,uVar5 / 0xb40,status);
            fptr->Fptr->heapsize = lVar8;
          }
          ffmaky(fptr,2,status);
          ffgkyjj(fptr,"PCOUNT",&pcount,comm,status);
          lVar8 = fptr->Fptr->heapsize;
          if (lVar8 != pcount) {
            ffmkyj(fptr,"PCOUNT",lVar8,comm,status);
          }
          ffrdef(fptr,status);
        }
        else {
          builtin_strncpy(message,"Failed to create copy of the heap",0x22);
          ffpmsg(message);
LAB_00140974:
          ffclos(tptr,status);
        }
      }
      else {
        builtin_strncpy(message + 0x20,"for the heap",0xd);
        builtin_strncpy(message + 0x10," temporary file ",0x10);
        builtin_strncpy(message,"Failed to create",0x10);
        ffpmsg(message);
      }
    }
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffcmph(fitsfile *fptr,  /* I -FITS file pointer                         */
           int *status)     /* IO - error status                            */
/*
  compress the binary table heap by reordering the contents heap and
  recovering any unused space
*/
{
    fitsfile *tptr;
    int jj, typecode, pixsize, valid;
    long ii, buffsize = 10000, nblock, nbytes;
    LONGLONG  unused, overlap;
    LONGLONG repeat, offset;
    char *buffer, *tbuff, comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG];
    LONGLONG pcount;
    LONGLONG readheapstart, writeheapstart, endpos, t1heapsize, t2heapsize;

    if (*status > 0)
        return(*status);

    /* get information about the current heap */
    fftheap(fptr, NULL, &unused, &overlap, &valid, status);

    if (!valid)
       return(*status = BAD_HEAP_PTR);  /* bad heap pointers */

    /* return if this is not a binary table HDU or if the heap is OK as is */
    if ( (fptr->Fptr)->hdutype != BINARY_TBL || (fptr->Fptr)->heapsize == 0 ||
         (unused == 0 && overlap == 0) || *status > 0 )
        return(*status);

    /* copy the current HDU to a temporary file in memory */
    if (ffinit( &tptr, "mem://tempheapfile", status) )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to create temporary file for the heap");
        ffpmsg(message);
        return(*status);
    }
    if ( ffcopy(fptr, tptr, 0, status) )
    {
        snprintf(message,FLEN_ERRMSG,"Failed to create copy of the heap");
        ffpmsg(message);
        ffclos(tptr, status);
        return(*status);
    }

    buffer = (char *) malloc(buffsize);  /* allocate initial buffer */
    if (!buffer)
    {
        snprintf(message,FLEN_ERRMSG,"Failed to allocate buffer to copy the heap");
        ffpmsg(message);
        ffclos(tptr, status);
        return(*status = MEMORY_ALLOCATION);
    }
    
    readheapstart  = (tptr->Fptr)->datastart + (tptr->Fptr)->heapstart;
    writeheapstart = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;

    t1heapsize = (fptr->Fptr)->heapsize;  /* save original heap size */
    (fptr->Fptr)->heapsize = 0;  /* reset heap to zero */

    /* loop over all cols */
    for (jj = 1; jj <= (fptr->Fptr)->tfield && *status <= 0; jj++)
    {
        ffgtcl(tptr, jj, &typecode, NULL, NULL, status);
        if (typecode > 0)
           continue;        /* ignore fixed length columns */

        pixsize = -typecode / 10;

        /* copy heap data, row by row */
        for (ii = 1; ii <= (fptr->Fptr)->numrows; ii++)
        {
            ffgdesll(tptr, jj, ii, &repeat, &offset, status);
            if (typecode == -TBIT)
                nbytes = (long) (repeat + 7) / 8;
            else
                nbytes = (long) repeat * pixsize;

            /* increase size of buffer if necessary to read whole array */
            if (nbytes > buffsize)
            {
                tbuff = realloc(buffer, nbytes);

                if (tbuff)
                {
                    buffer = tbuff;
                    buffsize = nbytes;
                }
                else
                    *status = MEMORY_ALLOCATION;
            }

            /* If this is not the last HDU in the file, then check if */
            /* extending the heap would overwrite the following header. */
            /* If so, then have to insert more blocks. */
            if ( !((fptr->Fptr)->lasthdu) )
            {
              endpos = writeheapstart + (fptr->Fptr)->heapsize + nbytes;

              if (endpos > (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1])
              {
                /* calc the number of blocks that need to be added */
                nblock = (long) (((endpos - 1 - 
                         (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] ) 
                         / 2880) + 1);

                if (ffiblk(fptr, nblock, 1, status) > 0) /* insert blocks */
                {
                  snprintf(message,FLEN_ERRMSG,
       "Failed to extend the size of the variable length heap by %ld blocks.",
                   nblock);
                   ffpmsg(message);
                }
              }
            }

            /* read arrray of bytes from temporary copy */
            ffmbyt(tptr, readheapstart + offset, REPORT_EOF, status);
            ffgbyt(tptr, nbytes, buffer, status);

            /* write arrray of bytes back to original file */
            ffmbyt(fptr, writeheapstart + (fptr->Fptr)->heapsize, 
                    IGNORE_EOF, status);
            ffpbyt(fptr, nbytes, buffer, status);

            /* write descriptor */
            ffpdes(fptr, jj, ii, repeat, 
                   (fptr->Fptr)->heapsize, status);

            (fptr->Fptr)->heapsize += nbytes; /* update heapsize */

            if (*status > 0)
            {
               free(buffer);
               ffclos(tptr, status);
               return(*status);
            }
        }
    }

    free(buffer);
    ffclos(tptr, status);

    /* delete any empty blocks at the end of the HDU */
    nblock = (long) (( (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] -
             (writeheapstart + (fptr->Fptr)->heapsize) ) / 2880);

    if (nblock > 0)
    {
       t2heapsize = (fptr->Fptr)->heapsize;  /* save new heap size */
       (fptr->Fptr)->heapsize = t1heapsize;  /* restore  original heap size */

       ffdblk(fptr, nblock, status);
       (fptr->Fptr)->heapsize = t2heapsize;  /* reset correct heap size */
    }

    /* update the PCOUNT value (size of heap) */
    ffmaky(fptr, 2, status);         /* reset to beginning of header */

    ffgkyjj(fptr, "PCOUNT", &pcount, comm, status);
    if ((fptr->Fptr)->heapsize != pcount)
    {
        ffmkyj(fptr, "PCOUNT", (fptr->Fptr)->heapsize, comm, status);
    }
    ffrdef(fptr, status);  /* rescan new HDU structure */
    return(*status);
}